

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

int canvas_try_insert(_glist *x,t_object *obj00,int in00,int out00,t_object *obj11,int in11,
                     int out11,t_object *obj22,int in22,int out22)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = 0;
  if ((-1 < (in11 | out00)) && ((in00 & out11 & in22 & out22) < 0)) {
    iVar1 = obj_issignaloutlet(obj00,out00);
    if ((iVar1 != 0) && (iVar1 = obj_issignalinlet(obj22,0), iVar1 == 0)) {
      return 0;
    }
    iVar1 = obj_issignaloutlet(obj22,0);
    if ((iVar1 != 0) && (iVar1 = obj_issignalinlet(obj11,in11), iVar1 == 0)) {
      return 0;
    }
    iVar1 = glist_getindex(x,&obj00->te_g);
    iVar2 = glist_getindex(x,&obj11->te_g);
    iVar3 = glist_getindex(x,&obj22->te_g);
    canvas_disconnect_with_undo(x,(float)iVar1,(float)out00,(float)iVar2,(float)in11);
    iVar4 = canvas_isconnected(x,obj00,out00,obj22,0);
    if (iVar4 == 0) {
      canvas_connect_with_undo(x,(float)iVar1,(float)out00,(float)iVar3,0.0);
    }
    iVar4 = canvas_isconnected(x,obj22,0,obj11,in11);
    iVar1 = 1;
    if (iVar4 == 0) {
      canvas_connect_with_undo(x,(float)iVar3,0.0,(float)iVar2,(float)in11);
    }
  }
  return iVar1;
}

Assistant:

static int canvas_try_insert(t_canvas *x
    , t_object* obj00, int in00, int out00 /* source */
    , t_object* obj11, int in11, int out11 /* sink   */
    , t_object* obj22, int in22, int out22 /* insert */
    )
{
    int out21 = 0, in02 = 0; /* iolets of the insert-objects */
    int A, B, C;

        /* check connections (obj00->obj11, but not obj22) */
    if(out00<0 || out22>=0 || out11>=0 || in00>=0 || in22>=0 || in11<0)
        return 0;

        /* check whether the connection types match */
    if((obj_issignaloutlet(obj00, out00) && !obj_issignalinlet(obj22, in02)))
        return 0;
    if((obj_issignaloutlet(obj22, out21) && !obj_issignalinlet(obj11, in11)))
        return 0;

        /* then connect them */
    A = glist_getindex(x, &obj00->te_g);
    B = glist_getindex(x, &obj11->te_g);
    C = glist_getindex(x, &obj22->te_g);

    canvas_disconnect_with_undo(x, A, out00, B, in11);
    if (!canvas_isconnected     (x, obj00, out00, obj22, in02))
        canvas_connect_with_undo(x, A,     out00, C,     in02);
    if (!canvas_isconnected     (x, obj22, out21, obj11, in11))
        canvas_connect_with_undo(x, C,     out21, B,     in11);
    return 1;
}